

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O2

void google::protobuf::FillArenaAwareFields(TestAllTypes *message)

{
  OneofFieldUnion *this;
  TestAllTypes_NestedMessage *pTVar1;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_NestedMessage>_>
  *pVVar2;
  Arena *pAVar3;
  allocator<char> local_31;
  string test_string;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&test_string,"hello world",&local_31)
  ;
  (message->field_0)._impl_.optional_int32_ = 0x2a;
  (message->field_0)._impl_._has_bits_.has_bits_[0] =
       (message->field_0)._impl_._has_bits_.has_bits_[0] | 0x1001;
  pAVar3 = (Arena *)(message->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar3 & 1) != 0) {
    pAVar3 = *(Arena **)((ulong)pAVar3 & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set<>(&(message->field_0)._impl_.optional_string_,&test_string,pAVar3);
  *(byte *)&message->field_0 = *(byte *)&message->field_0 | 2;
  pAVar3 = (Arena *)(message->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar3 & 1) != 0) {
    pAVar3 = *(Arena **)((ulong)pAVar3 & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set<>(&(message->field_0)._impl_.optional_bytes_,&test_string,pAVar3);
  pTVar1 = proto2_unittest::TestAllTypes::mutable_optional_nested_message(message);
  (pTVar1->field_0)._impl_.bb_ = 0x2a;
  *(byte *)&pTVar1->field_0 = *(byte *)&pTVar1->field_0 | 1;
  proto2_unittest::TestAllTypes::set_oneof_uint32(message,0x2a);
  pTVar1 = proto2_unittest::TestAllTypes::_internal_mutable_oneof_nested_message(message);
  (pTVar1->field_0)._impl_.bb_ = 0x2a;
  *(byte *)&pTVar1->field_0 = *(byte *)&pTVar1->field_0 | 1;
  if ((message->field_0)._impl_._oneof_case_[0] != 0x71) {
    proto2_unittest::TestAllTypes::clear_oneof_field(message);
    (message->field_0)._impl_._oneof_case_[0] = 0x71;
    (message->field_0)._impl_.oneof_field_.oneof_nested_message_ =
         (TestAllTypes_NestedMessage *)&internal::fixed_address_empty_string;
  }
  this = &(message->field_0)._impl_.oneof_field_;
  pAVar3 = (Arena *)(message->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar3 & 1) != 0) {
    pAVar3 = *(Arena **)((ulong)pAVar3 & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set<>(&this->oneof_string_,&test_string,pAVar3);
  if ((message->field_0)._impl_._oneof_case_[0] != 0x72) {
    proto2_unittest::TestAllTypes::clear_oneof_field(message);
    (message->field_0)._impl_._oneof_case_[0] = 0x72;
    (message->field_0)._impl_.oneof_field_.oneof_nested_message_ =
         (TestAllTypes_NestedMessage *)&internal::fixed_address_empty_string;
  }
  pAVar3 = (Arena *)(message->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar3 & 1) != 0) {
    pAVar3 = *(Arena **)((ulong)pAVar3 & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set<>(&this->oneof_string_,&test_string,pAVar3);
  RepeatedField<int>::Add(&(message->field_0)._impl_.repeated_int32_,0x2a);
  pVVar2 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_NestedMessage>>
                     (&(message->field_0)._impl_.repeated_nested_message_.super_RepeatedPtrFieldBase
                     );
  (pVVar2->field_0)._impl_.bb_ = 0x2a;
  *(byte *)&pVVar2->field_0 = *(byte *)&pVVar2->field_0 | 1;
  pTVar1 = proto2_unittest::TestAllTypes::mutable_optional_lazy_message(message);
  (pTVar1->field_0)._impl_.bb_ = 0x2a;
  *(byte *)&pTVar1->field_0 = *(byte *)&pTVar1->field_0 | 1;
  std::__cxx11::string::~string((string *)&test_string);
  return;
}

Assistant:

void FillArenaAwareFields(TestAllTypes* message) {
  std::string test_string = "hello world";
  message->set_optional_int32(42);
  message->set_optional_string(test_string);
  message->set_optional_bytes(test_string);
  message->mutable_optional_nested_message()->set_bb(42);

  message->set_oneof_uint32(42);
  message->mutable_oneof_nested_message()->set_bb(42);
  message->set_oneof_string(test_string);
  message->set_oneof_bytes(test_string);

  message->add_repeated_int32(42);
  // No repeated string: not yet arena-aware.
  message->add_repeated_nested_message()->set_bb(42);
  message->mutable_optional_lazy_message()->set_bb(42);
}